

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

bool absl::lts_20250127::str_format_internal::anon_unknown_0::FloatToSink<double>
               (double v,FormatConversionSpecImpl *conv,FormatSinkImpl *sink)

{
  undefined1 *puVar1;
  byte bVar2;
  string_view data_postfix;
  uint3 uVar3;
  undefined3 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  bool bVar7;
  char cVar8;
  char *pcVar9;
  size_t sVar10;
  FormatConversionChar FVar11;
  uint uVar12;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  undefined4 uVar16;
  undefined8 unaff_RBP;
  undefined7 uVar19;
  _anonymous_namespace_ *this;
  ulong uVar17;
  ulong uVar18;
  byte bVar20;
  int iVar21;
  uint64_t v_00;
  ulong uVar22;
  FormatState *in_R8;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  int total_bits;
  int iVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  double dVar32;
  ulong in_XMM0_Qb;
  undefined1 auVar33 [16];
  string_view value;
  Decomposed<double> decomposed;
  Decomposed<double> decomposed_00;
  uint128 v_01;
  string_view data;
  string_view str;
  char *__s;
  undefined1 local_15c [12];
  ulong uStack_150;
  FormatState local_148;
  char digits_buffer [20];
  size_t local_f8;
  char *pcStack_f0;
  char buffer [171];
  FormatSinkImpl *sink_00;
  
  uVar19 = (undefined7)((ulong)unaff_RBP >> 8);
  if ((long)v < 0) {
    dVar32 = -v;
    in_XMM0_Qb = in_XMM0_Qb ^ 0x8000000000000000;
    uVar16 = (undefined4)CONCAT71(uVar19,0x2d);
LAB_00210ca4:
    pcVar13 = buffer + 1;
    buffer[0] = (char)uVar16;
  }
  else {
    uVar16 = (undefined4)CONCAT71(uVar19,0x2b);
    dVar32 = v;
    if (((conv->flags_ & kShowPos) != kBasic) ||
       (uVar16 = (undefined4)CONCAT71(uVar19,0x20), (conv->flags_ & kSignCol) != kBasic))
    goto LAB_00210ca4;
    pcVar13 = buffer;
    uVar16 = 0;
  }
  if (NAN(dVar32)) {
    FVar11 = conv->conv_;
    pcVar15 = "NAN";
    pcVar9 = "nan";
LAB_00210cf4:
    if ((FVar11 & ~x) == F) {
      pcVar9 = pcVar15;
    }
    if (FVar11 == X) {
      pcVar9 = pcVar15;
    }
    pcVar13[2] = pcVar9[2];
    *(undefined2 *)pcVar13 = *(undefined2 *)pcVar9;
    value._M_len = pcVar13 + (3 - (long)buffer);
    in_R8 = (FormatState *)0xffffffffffffffff;
    value._M_str = buffer;
    local_15c._4_8_ = dVar32;
    uStack_150 = in_XMM0_Qb;
    bVar7 = FormatSinkImpl::PutPaddedString(sink,value,conv->width_,-1,(bool)(conv->flags_ & kLeft))
    ;
    dVar32 = (double)local_15c._4_8_;
    if (bVar7) {
      return true;
    }
  }
  else if (ABS(dVar32) == INFINITY) {
    FVar11 = conv->conv_;
    pcVar15 = "INF";
    pcVar9 = "inf";
    goto LAB_00210cf4;
  }
  uVar30 = 6;
  if (-1 < conv->precision_) {
    uVar30 = (ulong)(uint)conv->precision_;
  }
  local_15c._0_4_ = 0;
  dVar32 = frexp(dVar32,(int *)buffer);
  dVar32 = ldexp(dVar32,0x35);
  uVar6 = buffer._0_4_;
  uVar5 = digits_buffer._0_8_;
  FVar11 = conv->conv_;
  uVar12 = (FVar11 & 0xfffffffe) - 8;
  if (6 < uVar12) {
    return false;
  }
  local_15c._4_4_ = uVar16;
  uVar24 = buffer._0_4_ - 0x35;
  sink_00 = (FormatSinkImpl *)(ulong)uVar24;
  this = (_anonymous_namespace_ *)
         ((long)(dVar32 - 9.223372036854776e+18) & (long)dVar32 >> 0x3f | (long)dVar32);
  pcVar13 = (char *)((long)&switchD_00210dc7::switchdataD_00283930 +
                    (long)(int)(&switchD_00210dc7::switchdataD_00283930)[uVar12]);
  local_148.sign_char = (char)uVar16;
  local_148.precision = uVar30;
  local_148.conv = conv;
  local_148.sink = sink;
  switch(FVar11 & 0xfffffffe) {
  case 8:
    if ((int)buffer._0_4_ < 0x35) {
      if (uVar24 < 0xffffff80) {
        FormatFNegativeExpSlow
                  ((anon_unknown_0 *)this,(uint128)(ZEXT416(0x35 - buffer._0_4_) << 0x40),
                   (int)&local_148,in_R8);
        return true;
      }
      buffer[0x2a] = '.';
      uVar12 = 0x35 - buffer._0_4_;
      v_00 = 0;
      if (0xffffffc0 < uVar24) {
        v_00 = (ulong)this >> ((byte)uVar12 & 0x3f);
      }
      pcVar13 = PrintIntegralDigitsFromRightFast(v_00,buffer + 0x2a);
      sVar14 = local_148.precision;
      pcVar15 = pcVar13 + -1;
      pcVar13[-1] = '0';
      if (uVar24 < 0xffffffc0) {
        auVar33._8_8_ = 0;
        auVar33._0_8_ = buffer + 0x2b;
        pcVar9 = PrintFractionalDigitsFast
                           ((anon_unknown_0 *)this,(uint128)(auVar33 << 0x40),(char *)(ulong)uVar12,
                            (int)local_148.precision,(size_t)sink_00);
      }
      else {
        local_f8 = (long)this << ((char)uVar6 + 0xbU & 0x3f);
        lVar28 = 0;
        local_15c._4_8_ = pcVar15;
        for (lVar31 = 0; -lVar31 != sVar14; lVar31 = lVar31 + -1) {
          if (local_f8 == 0) goto LAB_0021136d;
          cVar8 = MultiplyBy10WithCarry<unsigned_long>(&local_f8,'\0');
          buffer[lVar28 + 0x2b] = cVar8 + '0';
          lVar28 = lVar28 + 1;
        }
        if ((long)local_f8 < 0) {
          RoundUp(buffer + (0x2a - lVar31));
        }
LAB_0021136d:
        pcVar9 = buffer + (0x2b - lVar31);
        pcVar15 = (char *)local_15c._4_8_;
      }
      if (pcVar13[-1] == '0') {
        pcVar15 = pcVar13;
      }
    }
    else {
      if (this == (_anonymous_namespace_ *)0x0) {
        uVar12 = 0x40;
      }
      else {
        lVar28 = 0x3f;
        if (this != (_anonymous_namespace_ *)0x0) {
          for (; (ulong)this >> lVar28 == 0; lVar28 = lVar28 + -1) {
          }
        }
        uVar12 = (uint)lVar28 ^ 0x3f;
      }
      iVar27 = (buffer._0_4_ - uVar12) + 0xb;
      if (0x80 < iVar27) {
        FormatFPositiveExpSlow
                  ((anon_unknown_0 *)this,(uint128)(ZEXT416(uVar24) << 0x40),(int)&local_148,in_R8);
        return true;
      }
      buffer[0x2a] = '.';
      pcVar9 = buffer + 0x2b;
      if (iVar27 < 0x41) {
        pcVar15 = PrintIntegralDigitsFromRightFast
                            ((long)this << ((byte)uVar24 & 0x3f),buffer + 0x2a);
      }
      else {
        auVar33 = __ashlti3(this,0,(ulong)sink_00 & 0xff);
        v_01.hi_ = (uint64_t)(buffer + 0x2a);
        v_01.lo_ = auVar33._8_8_;
        pcVar15 = PrintIntegralDigitsFromRightFast(auVar33._0_8_,v_01,pcVar13);
      }
    }
    pcVar13 = pcVar9 + -(long)pcVar15;
    if ((local_148.precision == 0) && (((local_148.conv)->flags_ & kAlt) == kBasic)) {
      pcVar13 = pcVar13 + -1;
    }
    digits_buffer[0] = '\0';
    digits_buffer[1] = '\0';
    digits_buffer[2] = '\0';
    digits_buffer[3] = '\0';
    digits_buffer[4] = '\0';
    digits_buffer[5] = '\0';
    digits_buffer[6] = '\0';
    digits_buffer[7] = '\0';
    pcVar9 = buffer + (local_148.precision - (long)pcVar9) + 0x2b;
    digits_buffer._8_8_ = (long)"\n\x02\b\x01" + 4;
    sVar10 = 0;
    __s = "";
    sVar14 = 0;
    goto LAB_002113ce;
  case 10:
    decomposed_00._8_8_ = uVar30;
    decomposed_00.mantissa = (MantissaType)sink_00;
    bVar7 = (anonymous_namespace)::
            FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,double>
                      (this,decomposed_00,(size_t)buffer,(Buffer *)local_15c,(int *)sink_00);
    if (!bVar7) {
LAB_00210ec5:
      bVar7 = FallbackToSnprintf<double>(v,conv,sink);
      return bVar7;
    }
    uVar12 = local_15c._0_4_;
    if (((conv->flags_ & kAlt) == kBasic) &&
       (pcVar13 = Buffer::back((Buffer *)buffer), uVar12 = local_15c._0_4_, *pcVar13 == '.')) {
      Buffer::pop_back((Buffer *)buffer);
      uVar12 = local_15c._0_4_;
    }
    break;
  case 0xc:
    uVar18 = 1;
    if (uVar30 != 0) {
      uVar18 = uVar30;
    }
    decomposed._8_8_ = uVar18 - 1;
    decomposed.mantissa = (MantissaType)sink_00;
    bVar7 = (anonymous_namespace)::
            FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,double>
                      (this,decomposed,(size_t)buffer,(Buffer *)local_15c,(int *)sink_00);
    if (!bVar7) goto LAB_00210ec5;
    uVar30 = (ulong)(int)local_15c._0_4_;
    uVar12 = local_15c._0_4_;
    if ((long)uVar30 < 0) {
      if (0xfffffffb < (uint)local_15c._0_4_) {
        *(undefined1 *)(buffer._88_8_ + 1) = *(undefined1 *)buffer._88_8_;
        while( true ) {
          puVar1 = (undefined1 *)(buffer._88_8_ + -1);
          if (-2 < (int)uVar30) break;
          *(undefined1 *)buffer._88_8_ = 0x30;
          uVar30 = (ulong)((int)uVar30 + 1);
          buffer._88_8_ = puVar1;
        }
        *(undefined1 *)buffer._88_8_ = 0x2e;
        *puVar1 = 0x30;
        uVar12 = 0;
        buffer._88_8_ = puVar1;
      }
    }
    else if (uVar30 < uVar18) {
      uVar12 = 0;
      if (local_15c._0_4_ != 0) {
        std::_V2::__rotate<char*>(buffer._88_8_ + 1,buffer._88_8_ + 2,buffer._88_8_ + uVar30 + 2);
        uVar12 = 0;
      }
    }
    if ((conv->flags_ & kAlt) == kBasic) {
      while( true ) {
        pcVar13 = Buffer::back((Buffer *)buffer);
        if (*pcVar13 != '0') break;
        Buffer::pop_back((Buffer *)buffer);
      }
      pcVar13 = Buffer::back((Buffer *)buffer);
      if (*pcVar13 == '.') {
        Buffer::pop_back((Buffer *)buffer);
      }
    }
    if (uVar12 == 0) goto LAB_00211343;
    break;
  case 0xe:
    iVar27 = conv->precision_;
    iVar21 = -0x3fe;
    if (buffer._0_4_ + 0xb < -0x3fe) {
      iVar21 = buffer._0_4_ + 0xb;
    }
    uVar12 = buffer._0_4_ + 10;
    for (; 0 < (long)this; this = (_anonymous_namespace_ *)((long)this * 2)) {
      if ((int)(uVar12 + 1) < -0x3fd) {
        uVar18 = (ulong)this >> (2U - (char)iVar21 & 0x3f);
        uVar29 = 0xfffffc02;
        uVar22 = 0;
        goto LAB_00210f39;
      }
      uVar12 = uVar12 - 1;
    }
    uVar22 = (ulong)this >> 0x3f;
    if (this == (_anonymous_namespace_ *)0x0) {
      uVar12 = 0;
    }
    uVar29 = (ulong)uVar12;
    uVar18 = (long)this * 2;
LAB_00210f39:
    bVar20 = (byte)uVar22;
    uVar17 = uVar18;
    if (-1 < iVar27) {
      uVar17 = 0;
      if (uVar30 < 0x11) {
        uVar17 = 0x10 - uVar30;
      }
      if ((uint)uVar30 < 0x10) {
        bVar2 = (char)uVar17 * '\x04';
        uVar23 = 0xffffffffffffffff >> ((char)uVar17 * -4 & 0x3fU);
        uVar25 = uVar18 & uVar23;
        uVar26 = 8L << (bVar2 - 4 & 0x3f);
        if (uVar25 == uVar26) {
          if (uVar17 != 0x10) {
            uVar22 = uVar18 >> (bVar2 & 0x3f) & 0xffffffff;
          }
          if ((uVar22 & 1) != 0) {
LAB_0021113d:
            lVar28 = 0;
            if (0xf >= uVar17) {
              lVar28 = 1L << (bVar2 & 0x3f);
            }
            bVar7 = (long)uVar18 < 0;
            uVar18 = uVar18 + lVar28;
            bVar20 = bVar20 + (-1 < (long)uVar18 && bVar7 || 0xf < uVar17);
          }
        }
        else if (uVar26 < uVar25) goto LAB_0021113d;
        uVar23 = ~uVar23;
      }
      else {
        uVar23 = 0xffffffffffffffff;
      }
      uVar18 = uVar18 & uVar23;
      uVar17 = uVar30;
    }
    lVar28 = (ulong)(FVar11 != A) * 0x10;
    uVar3 = CONCAT12("0123456789ABCDEF0123456789abcdef"[(ulong)bVar20 + lVar28],
                     CONCAT11((FVar11 != A) << 5,0x30));
    digits_buffer._0_3_ = uVar3 | 0x5800;
    uVar4 = digits_buffer._0_3_;
    digits_buffer._0_8_ = CONCAT53(digits_buffer._3_5_,uVar3) | 0x5800;
    if ((uVar17 == 0) && ((conv->flags_ & kAlt) == kBasic)) {
      pcVar13 = digits_buffer + 3;
    }
    else {
      pcVar13 = digits_buffer + 4;
      digits_buffer._4_4_ = SUB84(uVar5,4);
      digits_buffer[3] = '.';
      digits_buffer._0_4_ = CONCAT13(digits_buffer[3],uVar4);
    }
    uVar22 = 0;
    for (; uVar18 != 0; uVar18 = uVar18 << 4) {
      pcVar13[uVar22] = "0123456789ABCDEF0123456789abcdef"[(uVar18 >> 0x3c) + lVar28];
      uVar22 = uVar22 + 1;
    }
    if (iVar27 < 0) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = (char *)(uVar30 - uVar22);
      if (uVar30 < uVar22) {
        __assert_fail("state.precision >= digits_emitted",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                      ,0x3a5,
                      "void absl::str_format_internal::(anonymous namespace)::FormatA(const HexFloatTypeParams, Int, int, bool, const FormatState &) [Int = unsigned long]"
                     );
      }
    }
    pcVar15 = digits_buffer;
    pcVar13 = pcVar13 + (uVar22 - (long)pcVar15);
    buffer._0_4_ = CONCAT22(buffer._2_2_,
                            CONCAT11((char)(uVar29 >> 0x1f) * '\x02' + '+',(FVar11 != A) << 5)) |
                   0x50;
    iVar21 = (int)uVar29;
    iVar27 = -iVar21;
    if (0 < iVar21) {
      iVar27 = iVar21;
    }
    numbers_internal::FastIntToBuffer(iVar27,buffer + 2);
    __s = buffer;
    sVar10 = strlen(__s);
    sVar14 = 2;
    local_f8 = sVar10;
    pcStack_f0 = __s;
LAB_002113ce:
    data_postfix._M_str = __s;
    data_postfix._M_len = sVar10;
    data._M_str = pcVar15;
    data._M_len = (size_t)pcVar13;
    FinalPrint(&local_148,data,sVar14,(size_t)pcVar9,data_postfix);
    return true;
  }
  bVar20 = 0x45;
  if (conv->conv_ != X) {
    bVar20 = ((conv->conv_ & ~x) != F) << 5 | 0x45;
  }
  PrintExponent(uVar12,bVar20,(Buffer *)buffer);
LAB_00211343:
  str._M_str = (char *)conv;
  str._M_len._0_1_ = buffer[0x58];
  str._M_len._1_1_ = buffer[0x59];
  str._M_len._2_1_ = buffer[0x5a];
  str._M_len._3_1_ = buffer[0x5b];
  str._M_len._4_1_ = buffer[0x5c];
  str._M_len._5_1_ = buffer[0x5d];
  str._M_len._6_1_ = buffer[0x5e];
  str._M_len._7_1_ = buffer[0x5f];
  WriteBufferToSink((anon_unknown_0 *)(local_15c._4_8_ & 0xff),buffer[0x60] - (char)buffer._88_8_,
                    str,(FormatConversionSpecImpl *)sink,sink_00);
  return true;
}

Assistant:

bool FloatToSink(const Float v, const FormatConversionSpecImpl &conv,
                 FormatSinkImpl *sink) {
  // Print the sign or the sign column.
  Float abs_v = v;
  char sign_char = 0;
  if (std::signbit(abs_v)) {
    sign_char = '-';
    abs_v = -abs_v;
  } else if (conv.has_show_pos_flag()) {
    sign_char = '+';
  } else if (conv.has_sign_col_flag()) {
    sign_char = ' ';
  }

  // Print nan/inf.
  if (ConvertNonNumericFloats(sign_char, abs_v, conv, sink)) {
    return true;
  }

  size_t precision =
      conv.precision() < 0 ? 6 : static_cast<size_t>(conv.precision());

  int exp = 0;

  auto decomposed = Decompose(abs_v);

  Buffer buffer;

  FormatConversionChar c = conv.conversion_char();

  if (c == FormatConversionCharInternal::f ||
      c == FormatConversionCharInternal::F) {
    FormatF(decomposed.mantissa, decomposed.exponent,
            {sign_char, precision, conv, sink});
    return true;
  } else if (c == FormatConversionCharInternal::e ||
             c == FormatConversionCharInternal::E) {
    if (!FloatToBuffer<FormatStyle::Precision>(decomposed, precision, &buffer,
                                               &exp)) {
      return FallbackToSnprintf(v, conv, sink);
    }
    if (!conv.has_alt_flag() && buffer.back() == '.') buffer.pop_back();
    PrintExponent(
        exp, FormatConversionCharIsUpper(conv.conversion_char()) ? 'E' : 'e',
        &buffer);
  } else if (c == FormatConversionCharInternal::g ||
             c == FormatConversionCharInternal::G) {
    precision = std::max(precision, size_t{1}) - 1;
    if (!FloatToBuffer<FormatStyle::Precision>(decomposed, precision, &buffer,
                                               &exp)) {
      return FallbackToSnprintf(v, conv, sink);
    }
    if ((exp < 0 || precision + 1 > static_cast<size_t>(exp)) && exp >= -4) {
      if (exp < 0) {
        // Have 1.23456, needs 0.00123456
        // Move the first digit
        buffer.begin[1] = *buffer.begin;
        // Add some zeros
        for (; exp < -1; ++exp) *buffer.begin-- = '0';
        *buffer.begin-- = '.';
        *buffer.begin = '0';
      } else if (exp > 0) {
        // Have 1.23456, needs 1234.56
        // Move the '.' exp positions to the right.
        std::rotate(buffer.begin + 1, buffer.begin + 2, buffer.begin + exp + 2);
      }
      exp = 0;
    }
    if (!conv.has_alt_flag()) {
      while (buffer.back() == '0') buffer.pop_back();
      if (buffer.back() == '.') buffer.pop_back();
    }
    if (exp) {
      PrintExponent(
          exp, FormatConversionCharIsUpper(conv.conversion_char()) ? 'E' : 'e',
          &buffer);
    }
  } else if (c == FormatConversionCharInternal::a ||
             c == FormatConversionCharInternal::A) {
    bool uppercase = (c == FormatConversionCharInternal::A);
    FormatA(HexFloatTypeParams(Float{}), decomposed.mantissa,
            decomposed.exponent, uppercase, {sign_char, precision, conv, sink});
    return true;
  } else {
    return false;
  }

  WriteBufferToSink(
      sign_char,
      absl::string_view(buffer.begin,
                        static_cast<size_t>(buffer.end - buffer.begin)),
      conv, sink);

  return true;
}